

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O0

bool __thiscall csv::icu::StringDataSource::set(StringDataSource *this,string *text,char *codepage)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t length;
  char *pcVar4;
  char *local_108;
  UnicodeString local_f0 [68];
  uint local_ac;
  undefined1 local_a8 [8];
  detected_language detected;
  allocator local_49;
  string local_48 [8];
  string cp;
  char *codepage_local;
  string *text_local;
  StringDataSource *this_local;
  
  local_108 = codepage;
  if (codepage == (char *)0x0) {
    local_108 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_108,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (codepage == (char *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    length = std::__cxx11::string::length();
    encoding::TextEncodingForData((detected_language *)local_a8,pcVar3,length);
    bVar1 = encoding::detected_language::invalid((detected_language *)local_a8);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      std::__cxx11::string::operator=(local_48,(string *)local_a8);
    }
    local_ac = (uint)bVar1;
    encoding::detected_language::~detected_language((detected_language *)local_a8);
    if (local_ac != 0) goto LAB_0012ef24;
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = std::__cxx11::string::length();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  icu_70::UnicodeString::UnicodeString(local_f0,pcVar3,iVar2,pcVar4);
  icu_70::UnicodeString::operator=(&this->_in,local_f0);
  icu_70::UnicodeString::~UnicodeString(local_f0);
  this_local._7_1_ = 1;
  local_ac = 1;
LAB_0012ef24:
  std::__cxx11::string::~string(local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StringDataSource::set(const std::string& text, const char* codepage) {
		std::string cp = codepage ?: "";
		if (codepage == NULL) {
			const auto detected = encoding::TextEncodingForData(text.c_str(), text.length());
			if (detected.invalid()) {
				return false;
			}
			cp = detected.name;
		}

		_in = U_ICU_NAMESPACE::UnicodeString(text.c_str(), (int)(text.length()), cp.c_str());
		return true;
	}